

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float64 int64_to_float64_scalbn_ppc64(int64_t a,int scale,float_status *status)

{
  ulong uVar1;
  uint64_t uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  FloatParts FVar6;
  
  if (a == 0) {
    uVar5 = 0x100000000;
    uVar2 = 0;
  }
  else {
    uVar3 = -a;
    if (0 < a) {
      uVar3 = a;
    }
    uVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    iVar4 = -0x10000;
    if (-0x10000 < scale) {
      iVar4 = scale;
    }
    if (0xffff < iVar4) {
      iVar4 = 0x10000;
    }
    uVar5 = (ulong)(uint)(iVar4 + (int)uVar1) | (ulong)a >> 0x17 & 0x10000000000 | 0x200000000;
    uVar2 = 0x4000000000000000;
    if ((uVar1 ^ 0x3f) != 0) {
      uVar2 = uVar3 << ((char)(uVar1 ^ 0x3f) - 1U & 0x3f);
    }
  }
  FVar6.exp = (int)uVar5;
  FVar6.cls = (char)(uVar5 >> 0x20);
  FVar6.sign = (_Bool)(char)(uVar5 >> 0x28);
  FVar6._14_2_ = (short)(uVar5 >> 0x30);
  FVar6.frac = uVar2;
  FVar6 = round_canonical(FVar6,status,&float64_params);
  return FVar6.frac & 0xfffffffffffff | (ulong)(FVar6.exp & 0x7ff) << 0x34 |
         (FVar6._8_8_ & 0x10000000000) << 0x17;
}

Assistant:

float64 int64_to_float64_scalbn(int64_t a, int scale, float_status *status)
{
    FloatParts pa = int_to_float(a, scale, status);
    return float64_round_pack_canonical(pa, status);
}